

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

int nn_getsockopt(int s,int level,int option,void *optval,size_t *optvallen)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  nn_sock *sock;
  
  iVar1 = nn_global_hold_socket(&sock,s);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
  }
  else {
    if (optval == (void *)0x0 && optvallen != (size_t *)0x0) {
      iVar1 = -0xe;
    }
    else {
      iVar1 = nn_sock_getopt(sock,level,option,optval,optvallen);
      if (-1 < iVar1) {
        if (iVar1 == 0) {
          nn_mutex_lock(&self.lock);
          nn_sock_rele(sock);
          nn_mutex_unlock(&self.lock);
          return 0;
        }
        nn_backtrace_print();
        __stream = _stderr;
        pcVar3 = nn_err_strerror(-iVar1);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/global.c"
                ,0x253);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    nn_global_rele_socket(sock);
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
  }
  return -1;
}

Assistant:

int nn_getsockopt (int s, int level, int option, void *optval,
    size_t *optvallen)
{
    int rc;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    if (nn_slow (!optval && optvallen)) {
        rc = -EFAULT;
        goto fail;
    }

    rc = nn_sock_getopt (sock, level, option, optval, optvallen);
    if (nn_slow (rc < 0))
        goto fail;
    errnum_assert (rc == 0, -rc);
    nn_global_rele_socket (sock);
    return 0;

fail:
    nn_global_rele_socket (sock);
    errno = -rc;
    return -1;
}